

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_end(xml_buffered_writer *writer,xml_node_struct *node)

{
  size_t in_RCX;
  void *__buf;
  char_t *local_30;
  char_t *name;
  char_t *default_name;
  xml_node_struct *node_local;
  xml_buffered_writer *writer_local;
  
  if (node->name == (char_t *)0x0) {
    local_30 = ":anonymous";
  }
  else {
    local_30 = node->name;
  }
  xml_buffered_writer::write(writer,0x3c,(void *)0x2f,in_RCX);
  xml_buffered_writer::write_string(writer,local_30);
  xml_buffered_writer::write(writer,0x3e,__buf,in_RCX);
  return;
}

Assistant:

PUGI__FN void node_output_end(xml_buffered_writer& writer, xml_node_struct* node)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t* name = node->name ? node->name + 0 : default_name;

		writer.write('<', '/');
		writer.write_string(name);
		writer.write('>');
	}